

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O1

int DIR_stat(void *opaque,char *name,PHYSFS_Stat *stat)

{
  PHYSFS_Stat *st;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  PHYSFS_Stat **ppPVar5;
  undefined1 *ptr;
  ulong len;
  PHYSFS_Stat *local_38;
  
  ppPVar5 = &local_38;
  local_38 = stat;
  if (opaque == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen((char *)opaque);
  }
  sVar3 = strlen(name);
  len = sVar3 + sVar2 + 1;
  iVar1 = 0;
  if (len < 0x100) {
    ppPVar5 = (PHYSFS_Stat **)((long)&local_38 - (sVar3 + sVar2 + 0x18 & 0xfffffffffffffff0));
    ptr = (undefined1 *)ppPVar5;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)((long)ppPVar5 + -8) = 0x10c812;
  pcVar4 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)((long)ppPVar5 + -8) = 0x10c823;
  pcVar4 = cvtToDependent((char *)opaque,name,pcVar4,len);
  st = local_38;
  if (pcVar4 != (char *)0x0) {
    *(undefined8 *)((long)ppPVar5 + -8) = 0x10c837;
    iVar1 = __PHYSFS_platformStat(pcVar4,st);
    *(undefined8 *)((long)ppPVar5 + -8) = 0x10c842;
    __PHYSFS_smallFree(pcVar4);
  }
  return iVar1;
}

Assistant:

static int DIR_stat(void *opaque, const char *name, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *d;

    CVT_TO_DEPENDENT(d, opaque, name);
    BAIL_IF_ERRPASS(!d, 0);
    retval = __PHYSFS_platformStat(d, stat);
    __PHYSFS_smallFree(d);
    return retval;
}